

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O3

void __thiscall nuraft::buffer_serializer::put_u32(buffer_serializer *this,uint32_t val)

{
  size_t sVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  byte *pbVar6;
  overflow_error *this_00;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  
  bVar3 = (byte)(val >> 8);
  sVar1 = this->pos_;
  sVar5 = buffer::size(this->buf_);
  if (sVar5 < sVar1 + 4) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar6 = buffer::data_begin(this->buf_);
  bVar2 = (byte)(val >> 0x10);
  bVar9 = this->endian_ == LITTLE;
  bVar7 = (byte)(val >> 0x18);
  bVar8 = (byte)val;
  if (bVar9) {
    bVar8 = bVar7;
  }
  sVar1 = this->pos_;
  bVar4 = bVar3;
  if (bVar9) {
    bVar7 = (byte)val;
    bVar4 = bVar2;
    bVar2 = bVar3;
  }
  pbVar6[sVar1] = bVar7;
  pbVar6[sVar1 + 1] = bVar2;
  pbVar6[sVar1 + 2] = bVar4;
  pbVar6[sVar1 + 3] = bVar8;
  pos(this,this->pos_ + 4);
  return;
}

Assistant:

void buffer_serializer::put_u32(uint32_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { put32l(val, ptr); }
    else                    { put32b(val, ptr); }
    pos( pos() + sizeof(val) );
}